

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

void check_permission(char *filename,uint mode)

{
  int iVar1;
  __uid_t _Var2;
  undefined8 uVar3;
  uv_loop_t *puVar4;
  void *pvVar5;
  undefined8 *puVar6;
  char *pcVar7;
  uv_loop_t *puVar8;
  char *pcVar9;
  undefined8 *puVar10;
  uv_loop_t *puVar11;
  char *pcVar12;
  char *unaff_R14;
  char *pcVar13;
  char *pcVar14;
  uv_buf_t uVar15;
  uv_fs_t req;
  undefined1 auStack_938 [88];
  long lStack_8e0;
  long lStack_8d8;
  code *pcStack_780;
  code *pcStack_778;
  undefined8 uStack_770;
  char acStack_760 [88];
  char *pcStack_708;
  uv_loop_t *puStack_5a8;
  code *pcStack_5a0;
  code *pcStack_598;
  code *pcStack_590;
  uv_loop_t *puStack_588;
  code *pcStack_580;
  char acStack_578 [88];
  uv_loop_t *puStack_520;
  char *pcStack_3c0;
  code *pcStack_3b8;
  undefined8 uStack_3b0;
  char acStack_3a0 [88];
  char *pcStack_348;
  undefined8 *puStack_1e8;
  undefined1 local_1c0 [88];
  long local_168;
  uint local_148;
  
  puVar6 = (undefined8 *)(ulong)mode;
  puVar10 = (undefined8 *)0x0;
  iVar1 = uv_fs_stat(0,local_1c0,filename,0);
  if (iVar1 == 0) {
    if (local_168 != 0) goto LAB_00155388;
    if ((local_148 & 0x1ff) == mode) {
      uv_fs_req_cleanup(local_1c0);
      return;
    }
  }
  else {
    check_permission_cold_1();
LAB_00155388:
    check_permission_cold_2();
  }
  check_permission_cold_3();
  if (*(int *)(puVar10 + 8) == 0xd) {
    puVar6 = puVar10;
    if (puVar10[0xb] == 0) {
      chmod_cb_count = chmod_cb_count + 1;
      uv_fs_req_cleanup(puVar10);
      check_permission("test_file",*(uint *)*puVar10);
      return;
    }
  }
  else {
    chmod_cb_cold_1();
  }
  chmod_cb_cold_2();
  if (*(int *)(puVar10 + 8) == 0xe) {
    puVar6 = puVar10;
    if (puVar10[0xb] == 0) {
      fchmod_cb_count = fchmod_cb_count + 1;
      uv_fs_req_cleanup(puVar10);
      check_permission("test_file",*(uint *)*puVar10);
      return;
    }
  }
  else {
    fchmod_cb_cold_1();
  }
  fchmod_cb_cold_2();
  pcVar7 = "test_file";
  pcStack_3b8 = (code *)0x155421;
  puStack_1e8 = puVar6;
  unlink("test_file");
  pcStack_3b8 = (code *)0x155426;
  loop = (uv_loop_t *)uv_default_loop();
  pcStack_3b8 = (code *)0x15544a;
  iVar1 = uv_fs_open(0,acStack_3a0,"test_file",0x42,0x180,0);
  pcVar12 = pcStack_348;
  if (iVar1 < 0) {
    pcStack_3b8 = (code *)0x1555e7;
    run_test_fs_unlink_readonly_cold_1();
LAB_001555e7:
    pcStack_3b8 = (code *)0x1555ec;
    run_test_fs_unlink_readonly_cold_2();
LAB_001555ec:
    pcStack_3b8 = (code *)0x1555f1;
    run_test_fs_unlink_readonly_cold_3();
LAB_001555f1:
    pcStack_3b8 = (code *)0x1555f6;
    run_test_fs_unlink_readonly_cold_4();
LAB_001555f6:
    pcStack_3b8 = (code *)0x1555fb;
    run_test_fs_unlink_readonly_cold_5();
LAB_001555fb:
    pcStack_3b8 = (code *)0x155600;
    run_test_fs_unlink_readonly_cold_6();
LAB_00155600:
    pcStack_3b8 = (code *)0x155605;
    run_test_fs_unlink_readonly_cold_7();
LAB_00155605:
    pcStack_3b8 = (code *)0x15560a;
    run_test_fs_unlink_readonly_cold_8();
  }
  else {
    pcVar7 = pcStack_348;
    if ((long)pcStack_348 < 0) goto LAB_001555e7;
    unaff_R14 = acStack_3a0;
    pcStack_3b8 = (code *)0x15546d;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_3b8 = (code *)0x15547e;
    iov = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_3b0 = 0;
    pcStack_3b8 = (code *)0x1554b4;
    iVar1 = uv_fs_write(0,unaff_R14,(ulong)pcVar12 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar7 = pcVar12;
    if (iVar1 != 0xd) goto LAB_001555ec;
    if (pcStack_348 != (char *)0xd) goto LAB_001555f1;
    unaff_R14 = acStack_3a0;
    pcStack_3b8 = (code *)0x1554d6;
    uv_fs_req_cleanup(unaff_R14);
    pcStack_3b8 = (code *)0x1554e9;
    uv_fs_close(loop,unaff_R14,(ulong)pcVar12 & 0xffffffff,0);
    pcStack_3b8 = (code *)0x155502;
    iVar1 = uv_fs_chmod(0,unaff_R14,"test_file",0x100,0);
    if (iVar1 != 0) goto LAB_001555f6;
    if (pcStack_348 != (char *)0x0) goto LAB_001555fb;
    pcVar7 = acStack_3a0;
    pcStack_3b8 = (code *)0x155523;
    uv_fs_req_cleanup(pcVar7);
    unaff_R14 = "test_file";
    pcStack_3b8 = (code *)0x155537;
    check_permission("test_file",0x100);
    pcStack_3b8 = (code *)0x155546;
    iVar1 = uv_fs_unlink(0,pcVar7,"test_file",0);
    if (iVar1 != 0) goto LAB_00155600;
    if (pcStack_348 != (char *)0x0) goto LAB_00155605;
    pcStack_3b8 = (code *)0x155567;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3b8 = (code *)0x155575;
    uv_run(loop,0);
    unaff_R14 = "test_file";
    pcStack_3b8 = (code *)0x155591;
    uv_fs_chmod(0,acStack_3a0,"test_file",0x180,0);
    pcStack_3b8 = (code *)0x155599;
    uv_fs_req_cleanup(acStack_3a0);
    pcStack_3b8 = (code *)0x1555a1;
    unlink("test_file");
    pcStack_3b8 = (code *)0x1555a6;
    pcVar7 = (char *)uv_default_loop();
    pcStack_3b8 = (code *)0x1555ba;
    uv_walk(pcVar7,close_walk_cb,0);
    pcStack_3b8 = (code *)0x1555c4;
    uv_run(pcVar7,0);
    pcStack_3b8 = (code *)0x1555c9;
    uVar3 = uv_default_loop();
    pcStack_3b8 = (code *)0x1555d1;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_3b8 = run_test_fs_chown;
  run_test_fs_unlink_readonly_cold_9();
  pcVar13 = acStack_578;
  pcVar14 = acStack_578;
  pcVar9 = acStack_578;
  pcVar12 = acStack_578;
  puVar8 = (uv_loop_t *)0x184385;
  pcStack_580 = (code *)0x155628;
  pcStack_3c0 = pcVar7;
  pcStack_3b8 = (code *)unaff_R14;
  unlink("test_file");
  pcStack_580 = (code *)0x155634;
  unlink("test_file_link");
  pcStack_580 = (code *)0x155639;
  loop = (uv_loop_t *)uv_default_loop();
  puVar4 = (uv_loop_t *)0x0;
  pcStack_580 = (code *)0x15565b;
  iVar1 = uv_fs_open(0,acStack_578,"test_file",0x42,0x180,0);
  puVar11 = puStack_520;
  if (iVar1 < 0) {
    pcStack_580 = (code *)0x15592c;
    run_test_fs_chown_cold_1();
LAB_0015592c:
    pcStack_580 = (code *)0x155931;
    run_test_fs_chown_cold_2();
LAB_00155931:
    pcStack_580 = (code *)0x155936;
    run_test_fs_chown_cold_3();
LAB_00155936:
    pcVar13 = unaff_R14;
    pcStack_580 = (code *)0x15593b;
    run_test_fs_chown_cold_4();
LAB_0015593b:
    pcStack_580 = (code *)0x155940;
    run_test_fs_chown_cold_5();
LAB_00155940:
    pcVar14 = pcVar13;
    pcStack_580 = (code *)0x155945;
    run_test_fs_chown_cold_6();
LAB_00155945:
    pcStack_580 = (code *)0x15594a;
    run_test_fs_chown_cold_7();
LAB_0015594a:
    pcStack_580 = (code *)0x15594f;
    run_test_fs_chown_cold_8();
LAB_0015594f:
    pcStack_580 = (code *)0x155954;
    run_test_fs_chown_cold_9();
LAB_00155954:
    pcStack_580 = (code *)0x155959;
    run_test_fs_chown_cold_10();
LAB_00155959:
    pcStack_580 = (code *)0x15595e;
    run_test_fs_chown_cold_11();
LAB_0015595e:
    pcStack_580 = (code *)0x155963;
    run_test_fs_chown_cold_12();
LAB_00155963:
    pcStack_580 = (code *)0x155968;
    run_test_fs_chown_cold_13();
LAB_00155968:
    pcVar9 = pcVar14;
    pcStack_580 = (code *)0x15596d;
    run_test_fs_chown_cold_14();
LAB_0015596d:
    pcStack_580 = (code *)0x155972;
    run_test_fs_chown_cold_15();
LAB_00155972:
    pcVar12 = pcVar9;
    pcStack_580 = (code *)0x155977;
    run_test_fs_chown_cold_16();
LAB_00155977:
    pcStack_580 = (code *)0x15597c;
    run_test_fs_chown_cold_17();
LAB_0015597c:
    pcStack_580 = (code *)0x155981;
    run_test_fs_chown_cold_18();
LAB_00155981:
    pcStack_580 = (code *)0x155986;
    run_test_fs_chown_cold_19();
LAB_00155986:
    pcStack_580 = (code *)0x15598b;
    run_test_fs_chown_cold_20();
  }
  else {
    puVar8 = puStack_520;
    if ((long)puStack_520 < 0) goto LAB_0015592c;
    pcStack_580 = (code *)0x15567c;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x15569b;
    iVar1 = uv_fs_chown(0,acStack_578,"test_file",0xffffffff,0xffffffff,0);
    puVar8 = puVar11;
    unaff_R14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155931;
    unaff_R14 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155936;
    pcStack_580 = (code *)0x1556ba;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x1556d4;
    iVar1 = uv_fs_fchown(0,acStack_578,(ulong)puVar11 & 0xffffffff,0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015593b;
    pcVar13 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155940;
    pcStack_580 = (code *)0x1556f3;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x15571b;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_578,"test_file",0xffffffff,0xffffffff,chown_cb);
    if (iVar1 != 0) goto LAB_00155945;
    pcStack_580 = (code *)0x155731;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (chown_cb_count != 1) goto LAB_0015594a;
    chown_cb_count = 0;
    pcStack_580 = (code *)0x15576a;
    puVar4 = loop;
    iVar1 = uv_fs_chown(loop,acStack_578,"test_file",0,0,chown_root_cb);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_0015594f;
    pcStack_580 = (code *)0x155780;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (chown_cb_count != 1) goto LAB_00155954;
    pcStack_580 = (code *)0x1557b0;
    puVar4 = loop;
    iVar1 = uv_fs_fchown(loop,acStack_578,(ulong)puVar11 & 0xffffffff,0xffffffff,0xffffffff,
                         fchown_cb);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155959;
    pcStack_580 = (code *)0x1557c6;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar14 = acStack_578;
    if (fchown_cb_count != 1) goto LAB_0015595e;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x1557ee;
    iVar1 = uv_fs_link(0,acStack_578,"test_file","test_file_link",0);
    pcVar14 = acStack_578;
    if (iVar1 != 0) goto LAB_00155963;
    pcVar14 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155968;
    pcStack_580 = (code *)0x15580d;
    uv_fs_req_cleanup();
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x15582c;
    iVar1 = uv_fs_lchown(0,acStack_578,"test_file_link",0xffffffff,0xffffffff,0);
    if (iVar1 != 0) goto LAB_0015596d;
    pcVar9 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155972;
    pcStack_580 = (code *)0x15584b;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x155873;
    puVar4 = loop;
    iVar1 = uv_fs_lchown(loop,acStack_578,"test_file_link",0xffffffff,0xffffffff,lchown_cb);
    if (iVar1 != 0) goto LAB_00155977;
    pcStack_580 = (code *)0x155889;
    puVar4 = loop;
    uv_run(loop,0);
    pcVar12 = acStack_578;
    if (lchown_cb_count != 1) goto LAB_0015597c;
    puVar4 = (uv_loop_t *)0x0;
    pcStack_580 = (code *)0x1558a4;
    iVar1 = uv_fs_close(0,acStack_578,(ulong)puVar11 & 0xffffffff,0);
    pcVar12 = acStack_578;
    if (iVar1 != 0) goto LAB_00155981;
    pcVar12 = acStack_578;
    if (puStack_520 != (uv_loop_t *)0x0) goto LAB_00155986;
    pcStack_580 = (code *)0x1558c0;
    uv_fs_req_cleanup(acStack_578);
    pcStack_580 = (code *)0x1558ce;
    uv_run(loop,0);
    pcStack_580 = (code *)0x1558da;
    unlink("test_file");
    pcStack_580 = (code *)0x1558e6;
    unlink("test_file_link");
    pcStack_580 = (code *)0x1558eb;
    puVar8 = (uv_loop_t *)uv_default_loop();
    pcStack_580 = (code *)0x1558ff;
    uv_walk(puVar8,close_walk_cb,0);
    pcStack_580 = (code *)0x155909;
    uv_run(puVar8,0);
    pcStack_580 = (code *)0x15590e;
    puVar4 = (uv_loop_t *)uv_default_loop();
    pcStack_580 = (code *)0x155916;
    iVar1 = uv_loop_close();
    pcVar12 = acStack_578;
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_580 = chown_cb;
  run_test_fs_chown_cold_21();
  if (puVar4->backend_fd == 0x1a) {
    if (puVar4->watcher_queue[0] == (void *)0x0) {
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    puStack_588 = (uv_loop_t *)0x1559af;
    chown_cb_cold_1();
  }
  puStack_588 = (uv_loop_t *)chown_root_cb;
  chown_cb_cold_2();
  puStack_588 = puVar8;
  if (puVar4->backend_fd == 0x1a) {
    pcStack_590 = (code *)0x1559c3;
    puVar11 = puVar4;
    _Var2 = geteuid();
    pvVar5 = puVar4->watcher_queue[0];
    if (_Var2 != 0) {
      if (pvVar5 == (void *)0xffffffffffffffff) goto LAB_001559db;
      pcStack_590 = (code *)0x1559d6;
      chown_root_cb_cold_2();
    }
    puVar8 = puVar4;
    if (pvVar5 == (void *)0x0) {
LAB_001559db:
      chown_cb_count = chown_cb_count + 1;
      uv_fs_req_cleanup(puVar4);
      return;
    }
  }
  else {
    pcStack_590 = (code *)0x1559ef;
    chown_root_cb_cold_1();
    puVar11 = puVar4;
  }
  pcStack_590 = fchown_cb;
  chown_root_cb_cold_3();
  if (puVar11->backend_fd == 0x1b) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      fchown_cb_count = fchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_598 = (code *)0x155a13;
    fchown_cb_cold_1();
  }
  pcStack_598 = lchown_cb;
  fchown_cb_cold_2();
  if (puVar11->backend_fd == 0x1e) {
    if (puVar11->watcher_queue[0] == (void *)0x0) {
      lchown_cb_count = lchown_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_5a0 = (code *)0x155a37;
    lchown_cb_cold_1();
  }
  pcStack_5a0 = run_test_fs_link;
  lchown_cb_cold_2();
  pcVar9 = "test_file";
  pcStack_778 = (code *)0x155a55;
  puStack_5a8 = puVar8;
  pcStack_5a0 = (code *)pcVar12;
  unlink("test_file");
  pcStack_778 = (code *)0x155a61;
  unlink("test_file_link");
  pcStack_778 = (code *)0x155a6d;
  unlink("test_file_link2");
  pcStack_778 = (code *)0x155a72;
  loop = (uv_loop_t *)uv_default_loop();
  pcVar12 = (char *)0x0;
  pcStack_778 = (code *)0x155a96;
  iVar1 = uv_fs_open(0,acStack_760,"test_file",0x42,0x180,0);
  pcVar7 = pcStack_708;
  if (iVar1 < 0) {
    pcStack_778 = (code *)0x155dd4;
    run_test_fs_link_cold_1();
LAB_00155dd4:
    pcStack_778 = (code *)0x155dd9;
    run_test_fs_link_cold_2();
LAB_00155dd9:
    pcStack_778 = (code *)0x155dde;
    run_test_fs_link_cold_3();
LAB_00155dde:
    pcStack_778 = (code *)0x155de3;
    run_test_fs_link_cold_4();
LAB_00155de3:
    pcStack_778 = (code *)0x155de8;
    run_test_fs_link_cold_5();
LAB_00155de8:
    pcStack_778 = (code *)0x155ded;
    run_test_fs_link_cold_6();
LAB_00155ded:
    pcVar7 = pcVar9;
    pcStack_778 = (code *)0x155df2;
    run_test_fs_link_cold_7();
LAB_00155df2:
    pcStack_778 = (code *)0x155df7;
    run_test_fs_link_cold_8();
LAB_00155df7:
    pcStack_778 = (code *)0x155dfc;
    run_test_fs_link_cold_9();
LAB_00155dfc:
    pcStack_778 = (code *)0x155e01;
    run_test_fs_link_cold_10();
LAB_00155e01:
    pcStack_778 = (code *)0x155e06;
    run_test_fs_link_cold_11();
LAB_00155e06:
    pcStack_778 = (code *)0x155e0b;
    run_test_fs_link_cold_12();
LAB_00155e0b:
    pcStack_778 = (code *)0x155e10;
    run_test_fs_link_cold_13();
LAB_00155e10:
    pcVar9 = pcVar7;
    pcStack_778 = (code *)0x155e15;
    run_test_fs_link_cold_14();
LAB_00155e15:
    pcStack_778 = (code *)0x155e1a;
    run_test_fs_link_cold_15();
LAB_00155e1a:
    pcStack_778 = (code *)0x155e1f;
    run_test_fs_link_cold_16();
LAB_00155e1f:
    pcStack_778 = (code *)0x155e24;
    run_test_fs_link_cold_17();
LAB_00155e24:
    pcStack_778 = (code *)0x155e29;
    run_test_fs_link_cold_18();
  }
  else {
    pcVar9 = pcStack_708;
    if ((long)pcStack_708 < 0) goto LAB_00155dd4;
    pcStack_778 = (code *)0x155ab9;
    uv_fs_req_cleanup(acStack_760);
    pcStack_778 = (code *)0x155aca;
    uVar15 = (uv_buf_t)uv_buf_init(test_buf,0xd);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155b00;
    iov = uVar15;
    iVar1 = uv_fs_write(0,acStack_760,(ulong)pcVar7 & 0xffffffff,&iov,1,0xffffffffffffffff);
    pcVar9 = pcVar7;
    if (iVar1 != 0xd) goto LAB_00155dd9;
    if (pcStack_708 != (char *)0xd) goto LAB_00155dde;
    pcStack_778 = (code *)0x155b22;
    uv_fs_req_cleanup(acStack_760);
    pcStack_778 = (code *)0x155b35;
    uv_fs_close(loop,acStack_760,(ulong)pcVar7 & 0xffffffff,0);
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155b50;
    iVar1 = uv_fs_link(0,acStack_760,"test_file","test_file_link",0);
    if (iVar1 != 0) goto LAB_00155de3;
    if (pcStack_708 != (char *)0x0) goto LAB_00155de8;
    pcStack_778 = (code *)0x155b71;
    uv_fs_req_cleanup();
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155b8d;
    iVar1 = uv_fs_open(0,acStack_760,"test_file_link",2,0,0);
    pcVar7 = pcStack_708;
    pcVar9 = acStack_760;
    if (iVar1 < 0) goto LAB_00155ded;
    if ((long)pcStack_708 < 0) goto LAB_00155df2;
    pcStack_778 = (code *)0x155bb0;
    uv_fs_req_cleanup(acStack_760);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_778 = (code *)0x155bd2;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155c04;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_760,(ulong)pcVar7 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155df7;
    if ((long)pcStack_708 < 0) goto LAB_00155dfc;
    pcVar12 = buf;
    pcStack_778 = (code *)0x155c2b;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e01;
    pcStack_778 = (code *)0x155c3a;
    close((int)pcVar7);
    pcStack_778 = (code *)0x155c60;
    pcVar12 = (char *)loop;
    iVar1 = uv_fs_link(loop,acStack_760,"test_file","test_file_link2",link_cb);
    if (iVar1 != 0) goto LAB_00155e06;
    pcStack_778 = (code *)0x155c76;
    pcVar12 = (char *)loop;
    uv_run(loop,0);
    if (link_cb_count != 1) goto LAB_00155e0b;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155ca1;
    iVar1 = uv_fs_open(0,acStack_760,"test_file_link2",2,0,0);
    pcVar9 = pcStack_708;
    if (iVar1 < 0) goto LAB_00155e10;
    if ((long)pcStack_708 < 0) goto LAB_00155e15;
    pcStack_778 = (code *)0x155cc4;
    uv_fs_req_cleanup(acStack_760);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    pcStack_778 = (code *)0x155ce6;
    uVar15 = (uv_buf_t)uv_buf_init(buf,0x20);
    uStack_770 = 0;
    pcVar12 = (char *)0x0;
    pcStack_778 = (code *)0x155d18;
    iov = uVar15;
    iVar1 = uv_fs_read(0,acStack_760,(ulong)pcVar9 & 0xffffffff,&iov,1,0);
    if (iVar1 < 0) goto LAB_00155e1a;
    if ((long)pcStack_708 < 0) goto LAB_00155e1f;
    pcVar12 = buf;
    pcStack_778 = (code *)0x155d3f;
    iVar1 = strcmp(buf,test_buf);
    if (iVar1 != 0) goto LAB_00155e24;
    pcStack_778 = (code *)0x155d5c;
    uv_fs_close(loop,acStack_760,(ulong)pcVar9 & 0xffffffff,0);
    pcStack_778 = (code *)0x155d6a;
    uv_run(loop,0);
    pcStack_778 = (code *)0x155d76;
    unlink("test_file");
    pcStack_778 = (code *)0x155d82;
    unlink("test_file_link");
    pcStack_778 = (code *)0x155d8e;
    unlink("test_file_link2");
    pcStack_778 = (code *)0x155d93;
    pcVar9 = (char *)uv_default_loop();
    pcStack_778 = (code *)0x155da7;
    uv_walk(pcVar9,close_walk_cb,0);
    pcStack_778 = (code *)0x155db1;
    uv_run(pcVar9,0);
    pcStack_778 = (code *)0x155db6;
    pcVar12 = (char *)uv_default_loop();
    pcStack_778 = (code *)0x155dbe;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return;
    }
  }
  pcStack_778 = link_cb;
  run_test_fs_link_cold_19();
  if (((uv_loop_t *)pcVar12)->backend_fd == 0x17) {
    if (((uv_loop_t *)pcVar12)->watcher_queue[0] == (void *)0x0) {
      link_cb_count = link_cb_count + 1;
      uv_fs_req_cleanup();
      return;
    }
  }
  else {
    pcStack_780 = (code *)0x155e4d;
    link_cb_cold_1();
  }
  pcStack_780 = run_test_fs_readlink;
  link_cb_cold_2();
  pcStack_780 = (code *)pcVar9;
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_fs_readlink(loop,auStack_938,"no_such_file",dummy_cb);
  if (iVar1 == 0) {
    iVar1 = uv_run(loop,0);
    if (iVar1 != 0) goto LAB_00155f47;
    if (dummy_cb_count != 1) goto LAB_00155f4c;
    if (lStack_8d8 != 0) goto LAB_00155f51;
    if (lStack_8e0 != -2) goto LAB_00155f56;
    uv_fs_req_cleanup(auStack_938);
    iVar1 = uv_fs_readlink(0,auStack_938,"no_such_file",0);
    if (iVar1 != -2) goto LAB_00155f5b;
    if (lStack_8d8 != 0) goto LAB_00155f60;
    if (lStack_8e0 == -2) {
      uv_fs_req_cleanup(auStack_938);
      uVar3 = uv_default_loop();
      uv_walk(uVar3,close_walk_cb,0);
      uv_run(uVar3,0);
      uVar3 = uv_default_loop();
      iVar1 = uv_loop_close(uVar3);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00155f6a;
    }
  }
  else {
    run_test_fs_readlink_cold_1();
LAB_00155f47:
    run_test_fs_readlink_cold_2();
LAB_00155f4c:
    run_test_fs_readlink_cold_3();
LAB_00155f51:
    run_test_fs_readlink_cold_4();
LAB_00155f56:
    run_test_fs_readlink_cold_5();
LAB_00155f5b:
    run_test_fs_readlink_cold_6();
LAB_00155f60:
    run_test_fs_readlink_cold_7();
  }
  run_test_fs_readlink_cold_8();
LAB_00155f6a:
  run_test_fs_readlink_cold_9();
  dummy_cb_count = dummy_cb_count + 1;
  return;
}

Assistant:

static void check_permission(const char* filename, unsigned int mode) {
  int r;
  uv_fs_t req;
  uv_stat_t* s;

  r = uv_fs_stat(NULL, &req, filename, NULL);
  ASSERT(r == 0);
  ASSERT(req.result == 0);

  s = &req.statbuf;
#if defined(_WIN32) || defined(__CYGWIN__) || defined(__MSYS__)
  /*
   * On Windows, chmod can only modify S_IWUSR (_S_IWRITE) bit,
   * so only testing for the specified flags.
   */
  ASSERT((s->st_mode & 0777) & mode);
#else
  ASSERT((s->st_mode & 0777) == mode);
#endif

  uv_fs_req_cleanup(&req);
}